

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
Measurements::BenchmarkBase<Measurements::BestCase>::run_poly_vec
          (BenchmarkBase<Measurements::BestCase> *this)

{
  BestCase *pBVar1;
  iterator iVar2;
  iterator iVar3;
  uint local_14;
  uint c;
  BenchmarkBase<Measurements::BestCase> *this_local;
  
  for (local_14 = 0; local_14 < this->iteration_count; local_14 = local_14 + 1) {
    pBVar1 = derived(this);
    iVar2 = poly::
            vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
            ::begin(&pBVar1->pv);
    pBVar1 = derived(this);
    iVar3 = poly::
            vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
            ::end(&pBVar1->pv);
    std::
    for_each<poly::vector_iterator<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<std::allocator<Interface>>>>,Measurements::BenchmarkBase<Measurements::BestCase>::run_poly_vec()::_lambda(Interface&)_1_>
              (iVar2.curr,iVar3.curr);
  }
  return;
}

Assistant:

auto     run_poly_vec()
    {
        for (auto c = 0U; c < iteration_count; c++) {
            std::for_each(
                derived().pv.begin(), derived().pv.end(), [](Interface& i) { i.doYourThing(); });
        }
    }